

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCases.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::Texture2DRenderCase::Texture2DRenderCase
          (Texture2DRenderCase *this,Context *context,char *name,char *description,
          deUint32 internalFormat,deUint32 wrapS,deUint32 wrapT,deUint32 minFilter,
          deUint32 magFilter,Mat3 *coordTransform,int numTextures,bool powerOfTwo)

{
  Vector<tcu::Vector<float,_3>,_3> *pVVar1;
  Vector<float,_3> *pVVar2;
  Mat3 *pMVar3;
  long lVar4;
  long lVar5;
  
  deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
            (&this->super_ShaderPerformanceCase,context->m_testCtx,context->m_renderCtx,name,
             description,CASETYPE_FRAGMENT);
  (this->super_ShaderPerformanceCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DRenderCase_00d17e50;
  this->m_internalFormat = internalFormat;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  pMVar3 = &this->m_coordTransform;
  (this->m_coordTransform).m_data.m_data[0].m_data[0] = 0.0;
  (this->m_coordTransform).m_data.m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((this->m_coordTransform).m_data.m_data[0].m_data + 2) = 0;
  pVVar2 = (this->m_coordTransform).m_data.m_data;
  pVVar2[1].m_data[1] = 0.0;
  pVVar2[1].m_data[2] = 0.0;
  pVVar1 = &(this->m_coordTransform).m_data;
  pVVar1->m_data[2].m_data[0] = 0.0;
  pVVar1->m_data[2].m_data[1] = 0.0;
  (this->m_coordTransform).m_data.m_data[2].m_data[2] = 0.0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)(pMVar3->m_data).m_data[0].m_data + lVar5) =
           *(undefined4 *)((long)coordTransform + lVar5);
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar4 = lVar4 + 1;
    pMVar3 = (Mat3 *)((pMVar3->m_data).m_data[0].m_data + 1);
    coordTransform = (Mat3 *)((long)coordTransform + 4);
  } while (lVar4 != 3);
  this->m_numTextures = numTextures;
  this->m_powerOfTwo = powerOfTwo;
  (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Texture2DRenderCase::Texture2DRenderCase (Context&			context,
										  const char*		name,
										  const char*		description,
										  deUint32			internalFormat,
										  deUint32			wrapS,
										  deUint32			wrapT,
										  deUint32			minFilter,
										  deUint32			magFilter,
										  const tcu::Mat3&	coordTransform,
										  int				numTextures,
										  bool				powerOfTwo)
	: ShaderPerformanceCase	(context.getTestContext(), context.getRenderContext(), name, description, CASETYPE_FRAGMENT)
	, m_internalFormat		(internalFormat)
	, m_wrapS				(wrapS)
	, m_wrapT				(wrapT)
	, m_minFilter			(minFilter)
	, m_magFilter			(magFilter)
	, m_coordTransform		(coordTransform)
	, m_numTextures			(numTextures)
	, m_powerOfTwo			(powerOfTwo)
{
}